

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void tlbimva_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uc_struct_conflict2 *puVar1;
  _Bool _Var2;
  CPUState *src;
  ulong addr;
  CPUState *cs;
  uc_struct_conflict2 *uc;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  puVar1 = env->uc;
  src = env_cpu(env);
  addr = puVar1->init_target_page->mask & value;
  _Var2 = tlb_force_broadcast(env);
  if (_Var2) {
    tlb_flush_page_all_cpus_synced_aarch64(src,addr);
  }
  else {
    tlb_flush_page_aarch64(src,addr);
  }
  return;
}

Assistant:

static void tlbimva_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          uint64_t value)
{
    struct uc_struct *uc = env->uc;
    /* Invalidate single TLB entry by MVA and ASID (TLBIMVA) */
    CPUState *cs = env_cpu(env);

    value &= TARGET_PAGE_MASK;
    if (tlb_force_broadcast(env)) {
        tlb_flush_page_all_cpus_synced(cs, value);
    } else {
        tlb_flush_page(cs, value);
    }
}